

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::task_pool::task_pool(task_pool *this)

{
  task_pool *this_local;
  
  tsstack<crnlib::task_pool::task,_64U>::tsstack(&this->m_task_stack);
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,0x7fff,(char *)0x0);
  semaphore::semaphore(&this->m_all_tasks_completed,0,1,(char *)0x0);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  this->m_exit_flag = 0;
  utils::zero_object<unsigned_long[64]>(&this->m_threads);
  return;
}

Assistant:

task_pool::task_pool()
    : m_num_threads(0),
      m_tasks_available(0, 32767),
      m_all_tasks_completed(0, 1),
      m_total_submitted_tasks(0),
      m_total_completed_tasks(0),
      m_exit_flag(false) {
  utils::zero_object(m_threads);
}